

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall
wabt::WastLexer::GetNameEqNumToken
          (Token *__return_storage_ptr__,WastLexer *this,string_view name,TokenType token_type)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  size_t offset;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  size_t sVar10;
  uint uVar11;
  
  offset = name.size_;
  pbVar6 = (byte *)this->cursor_;
  pbVar5 = pbVar6;
  if (offset != 0) {
    sVar10 = 0;
    pbVar4 = pbVar6;
    do {
      cVar1 = name.data_[sVar10];
      uVar11 = 0xffffffff;
      pbVar5 = pbVar4;
      if (pbVar4 < this->buffer_end_) {
        pbVar5 = pbVar4 + 1;
        this->cursor_ = (char *)pbVar5;
        uVar11 = (uint)*pbVar4;
      }
      if (uVar11 != (int)cVar1) {
        this->cursor_ = (char *)pbVar6;
        goto LAB_001648ed;
      }
      sVar10 = sVar10 + 1;
      pbVar4 = pbVar5;
    } while (offset != sVar10);
  }
  lVar9 = 0;
  pbVar6 = pbVar5;
  do {
    uVar11 = 0xffffffff;
    pbVar4 = pbVar6;
    if (pbVar6 < this->buffer_end_) {
      pbVar4 = pbVar6 + 1;
      this->cursor_ = (char *)pbVar4;
      uVar11 = (uint)*pbVar6;
    }
    if (uVar11 != (int)":0x"[lVar9 + 1]) {
      this->cursor_ = (char *)pbVar5;
      bVar2 = ReadNum(this);
      if (!bVar2) goto LAB_001648ed;
      pbVar5 = (byte *)this->buffer_end_;
      pbVar6 = (byte *)this->cursor_;
      if (pbVar5 <= pbVar6) goto LAB_001648d7;
      iVar3 = (int)pbVar6;
      iVar7 = 0;
      goto LAB_001648b7;
    }
    lVar9 = lVar9 + 1;
    pbVar6 = pbVar4;
  } while (lVar9 != 2);
  bVar2 = ReadHexNum(this);
  if (!bVar2) goto LAB_001648ed;
  pbVar5 = (byte *)this->buffer_end_;
  pbVar6 = (byte *)this->cursor_;
  if (pbVar5 <= pbVar6) goto LAB_001648d7;
  iVar3 = (int)pbVar6;
  iVar7 = 0;
  do {
    iVar8 = iVar7;
    if ((""[(ulong)*pbVar6 + 1] & 1U) == 0) break;
    pbVar6 = pbVar6 + 1;
    this->cursor_ = (char *)pbVar6;
    iVar7 = iVar7 + 1;
    iVar8 = (int)pbVar5 - iVar3;
  } while (pbVar6 != pbVar5);
  goto LAB_001648d3;
  while( true ) {
    pbVar6 = pbVar6 + 1;
    this->cursor_ = (char *)pbVar6;
    iVar7 = iVar7 + 1;
    iVar8 = (int)pbVar5 - iVar3;
    if (pbVar6 == pbVar5) break;
LAB_001648b7:
    iVar8 = iVar7;
    if ((""[(ulong)*pbVar6 + 1] & 1U) == 0) break;
  }
LAB_001648d3:
  if (iVar8 == 0) {
LAB_001648d7:
    TextToken(__return_storage_ptr__,this,token_type,offset);
    return __return_storage_ptr__;
  }
LAB_001648ed:
  GetKeywordToken(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetNameEqNumToken(string_view name, TokenType token_type) {
  if (MatchString(name)) {
    if (MatchString("0x")) {
      if (ReadHexNum() && NoTrailingReservedChars()) {
        return TextToken(token_type, name.size());
      }
    } else if (ReadNum() && NoTrailingReservedChars()) {
      return TextToken(token_type, name.size());
    }
  }
  return GetKeywordToken();
}